

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readBoundaryTags
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  size_type __n;
  char *__filename;
  domain_error *this;
  reference pvVar1;
  ulong local_c0;
  size_t i;
  unsigned_long byteOffset;
  string local_a8 [32];
  FILE *local_88;
  FILE *f;
  value_type_conflict1 local_78;
  undefined1 local_71;
  int local_70;
  int nrequested;
  string local_60 [32];
  int local_40;
  int local_3c;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  int nquad;
  int ntri;
  int nnodes;
  int iStack_1c;
  bool swapBytes_local;
  int end_local;
  int begin_local;
  string *filename_local;
  vector<int,_std::allocator<int>_> *tags;
  
  ntri._3_1_ = swapBytes;
  nnodes = end;
  iStack_1c = begin;
  _end_local = filename;
  filename_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_60,(string *)filename);
  readHeader((string *)local_60,&nquad,&ntet,&npyr,&nprism,&nhex,&local_3c,&local_40,
             (bool)(ntri._3_1_ & 1));
  std::__cxx11::string::~string(local_60);
  local_70 = nnodes - iStack_1c;
  local_71 = 0;
  __n = (size_type)local_70;
  local_78 = 0;
  std::allocator<int>::allocator((allocator<int> *)((long)&f + 7));
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,&local_78,(allocator<int> *)((long)&f + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&f + 7));
  __filename = (char *)std::__cxx11::string::c_str();
  local_88 = fopen(__filename,"rb");
  if (local_88 == (FILE *)0x0) {
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Could not open .ugrid file: ");
    std::domain_error::domain_error(this,local_a8);
    __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  fseek(local_88,(long)(nquad * 3) * 8 + 0x1c + (long)(ntet * 3) * 4 + (long)(npyr << 2) * 4 +
                 (long)iStack_1c * 4,0);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  fread(pvVar1,4,(long)local_70,local_88);
  fclose(local_88);
  if ((ntri._3_1_ & 1) != 0) {
    for (local_c0 = 0; local_c0 < (ulong)(long)local_70; local_c0 = local_c0 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,local_c0);
      bswap_32(pvVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readBoundaryTags(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> tags(nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*nquad*sizeof(int);
    byteOffset += begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&tags[0],sizeof(int),nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < nrequested; i++) {
            bswap_32(&tags[i]);
        }
    }
    return tags;
}